

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

uint32_t ect_predict(ect *e,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint32_t uVar7;
  size_t sVar8;
  
  uVar7 = 1;
  if (e->k != 1) {
    (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
    (ec->l).simple.initial = 0.0;
    sVar8 = e->tree_height;
    uVar5 = 0;
    while (uVar4 = uVar5, sVar8 != 0) {
      sVar8 = sVar8 - 1;
      uVar3 = 1L << (sVar8 & 0x3f);
      uVar5 = uVar4;
      if ((uVar4 | uVar3) <= e->errors) {
        iVar6 = ((uint)uVar4 | 1 << ((uint)sVar8 & 0x1f)) + e->last_pair + -1;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar6 * *(int *)(base + 0xe0));
        uVar5 = uVar4 | uVar3 & 0xffffffff;
        if ((ec->pred).scalar < e->class_boundary || (ec->pred).scalar == e->class_boundary) {
          uVar5 = uVar4;
        }
      }
    }
    uVar2 = (e->final_nodes)._begin[uVar4];
    uVar5 = e->k;
    while (uVar5 <= uVar2) {
      iVar6 = uVar2 - (int)uVar5;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(iVar6 * *(int *)(base + 0xe0));
      uVar2 = (&(e->directions)._begin[uVar2].left)
              [e->class_boundary <= (ec->pred).scalar && (ec->pred).scalar != e->class_boundary];
      uVar5 = e->k;
    }
    uVar7 = uVar2 + 1;
  }
  return uVar7;
}

Assistant:

uint32_t ect_predict(ect& e, single_learner& base, example& ec)
{
  if (e.k == (size_t)1)
    return 1;

  uint32_t finals_winner = 0;

  // Binary final elimination tournament first
  ec.l.simple = {FLT_MAX, 0., 0.};

  for (size_t i = e.tree_height - 1; i != (size_t)0 - 1; i--)
  {
    if ((finals_winner | (((size_t)1) << i)) <= e.errors)
    {
      // a real choice exists
      uint32_t problem_number = e.last_pair + (finals_winner | (((uint32_t)1) << i)) - 1;  // This is unique.

      base.learn(ec, problem_number);

      if (ec.pred.scalar > e.class_boundary)
        finals_winner = finals_winner | (((size_t)1) << i);
    }
  }

  uint32_t id = e.final_nodes[finals_winner];
  while (id >= e.k)
  {
    base.learn(ec, id - e.k);

    if (ec.pred.scalar > e.class_boundary)
      id = e.directions[id].right;
    else
      id = e.directions[id].left;
  }
  return id + 1;
}